

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O2

void h264_print_picparm(h264_picparm *picparm)

{
  uint32_t (*pauVar1) [16];
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t (*pauVar5) [16];
  uint32_t (*pauVar6) [16];
  uint32_t (*local_48) [16];
  uint32_t (*local_40) [16];
  
  puts("Picture parameter set:");
  printf("\tpic_parameter_set_id = %d\n",(ulong)picparm->pic_parameter_set_id);
  printf("\tseq_parameter_set_id = %d\n",(ulong)picparm->seq_parameter_set_id);
  printf("\tentropy_coding_mode_flag = %d\n",(ulong)picparm->entropy_coding_mode_flag);
  printf("\tbottom_field_pic_order_in_frame_present_flag = %d\n",
         (ulong)picparm->bottom_field_pic_order_in_frame_present_flag);
  printf("\tnum_slice_groups_minus1 = %d\n",(ulong)picparm->num_slice_groups_minus1);
  if (picparm->num_slice_groups_minus1 != 0) {
    printf("\tslice_group_map_type = %d\n",(ulong)picparm->slice_group_map_type);
    switch(picparm->slice_group_map_type) {
    case 0:
      for (uVar4 = 0; uVar4 <= picparm->num_slice_groups_minus1; uVar4 = uVar4 + 1) {
        printf("\trun_length_minus1[%d] = %d\n",uVar4 & 0xffffffff,
               (ulong)picparm->run_length_minus1[uVar4]);
      }
      break;
    case 2:
      for (uVar4 = 0; uVar4 < picparm->num_slice_groups_minus1; uVar4 = uVar4 + 1) {
        printf("\ttop_left[%d] = %d\n",uVar4 & 0xffffffff,(ulong)picparm->top_left[uVar4]);
        printf("\tbottom_right[%d] = %d\n",uVar4 & 0xffffffff,(ulong)picparm->bottom_right[uVar4]);
      }
      break;
    case 3:
    case 4:
    case 5:
      printf("\tslice_group_change_direction_flag = %d\n",
             (ulong)picparm->slice_group_change_direction_flag);
      printf("\tslice_group_change_rate_minus1 = %d\n",
             (ulong)picparm->slice_group_change_rate_minus1);
      break;
    case 6:
      printf("\tpic_size_in_map_units_minus1 = %d\n",(ulong)picparm->pic_size_in_map_units_minus1);
      for (uVar4 = 0; uVar4 <= picparm->pic_size_in_map_units_minus1; uVar4 = uVar4 + 1) {
        printf("\tslice_group_id[%d] = %d\n",uVar4 & 0xffffffff,
               (ulong)picparm->slice_group_id[uVar4]);
      }
    }
  }
  printf("\tnum_ref_idx_l0_default_active_minus1 = %d\n",
         (ulong)picparm->num_ref_idx_l0_default_active_minus1);
  printf("\tnum_ref_idx_l1_default_active_minus1 = %d\n",
         (ulong)picparm->num_ref_idx_l1_default_active_minus1);
  printf("\tweighted_pred_flag = %d\n",(ulong)picparm->weighted_pred_flag);
  printf("\tweighted_bipred_idc = %d\n",(ulong)picparm->weighted_bipred_idc);
  printf("\tpic_init_qp_minus26 = %d\n",(ulong)(uint)picparm->pic_init_qp_minus26);
  printf("\tpic_init_qs_minus26 = %d\n",(ulong)(uint)picparm->pic_init_qs_minus26);
  printf("\tchroma_qp_index_offset = %d\n",(ulong)(uint)picparm->chroma_qp_index_offset);
  printf("\tdeblocking_filter_control_present_flag = %d\n",
         (ulong)picparm->deblocking_filter_control_present_flag);
  printf("\tconstrained_intra_pred_flag = %d\n",(ulong)picparm->constrained_intra_pred_flag);
  printf("\tredundant_pic_cnt_present_flag = %d\n",(ulong)picparm->redundant_pic_cnt_present_flag);
  printf("\ttransform_8x8_mode_flag = %d\n",(ulong)picparm->transform_8x8_mode_flag);
  printf("\tpic_scaling_matrix_present_flag = %d\n",(ulong)picparm->pic_scaling_matrix_present_flag)
  ;
  if (picparm->pic_scaling_matrix_present_flag != 0) {
    local_40 = picparm->pic_scaling_list_4x4;
    local_48 = (uint32_t (*) [16])(picparm[-1].pic_scaling_list_8x8[2] + 0x2a);
    for (uVar4 = 0; uVar4 < (ulong)(picparm->chroma_format_idc == 3) * 4 + 8; uVar4 = uVar4 + 1) {
      printf("\tpic_scaling_list_present_flag[%d] = %d\n",uVar4 & 0xffffffff,
             (ulong)picparm->pic_scaling_list_present_flag[uVar4]);
      if ((picparm->pic_scaling_list_present_flag[uVar4] != 0) &&
         (printf("\tuse_default_scaling_matrix_flag[%d] = %d\n",uVar4 & 0xffffffff,
                 (ulong)picparm->use_default_scaling_matrix_flag[uVar4]),
         picparm->use_default_scaling_matrix_flag[uVar4] == 0)) {
        uVar2 = 0x40;
        if (uVar4 < 6) {
          uVar2 = 0x10;
        }
        pauVar5 = local_48;
        pauVar6 = local_40;
        for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
          pauVar1 = pauVar5;
          if (uVar4 < 6) {
            pauVar1 = pauVar6;
          }
          printf("\tpic_scaling_list[%d][%d] = %d\n",uVar4 & 0xffffffff,uVar3 & 0xffffffff,
                 (ulong)(*pauVar1)[0]);
          pauVar6 = (uint32_t (*) [16])(*pauVar6 + 1);
          pauVar5 = (uint32_t (*) [16])(*pauVar5 + 1);
        }
      }
      local_40 = local_40 + 1;
      local_48 = local_48 + 4;
    }
  }
  printf("\tsecond_chroma_qp_index_offset = %d\n",
         (ulong)(uint)picparm->second_chroma_qp_index_offset);
  return;
}

Assistant:

void h264_print_picparm(struct h264_picparm *picparm) {
	printf("Picture parameter set:\n");
	printf ("\tpic_parameter_set_id = %d\n", picparm->pic_parameter_set_id);
	printf ("\tseq_parameter_set_id = %d\n", picparm->seq_parameter_set_id);
	printf ("\tentropy_coding_mode_flag = %d\n", picparm->entropy_coding_mode_flag);
	printf ("\tbottom_field_pic_order_in_frame_present_flag = %d\n", picparm->bottom_field_pic_order_in_frame_present_flag);
	printf ("\tnum_slice_groups_minus1 = %d\n", picparm->num_slice_groups_minus1);
	if (picparm->num_slice_groups_minus1) {
		int i;
		printf ("\tslice_group_map_type = %d\n", picparm->slice_group_map_type);
		switch (picparm->slice_group_map_type) {
			case H264_SLICE_GROUP_MAP_INTERLEAVED:
				for (i = 0; i <= picparm->num_slice_groups_minus1; i++) {
					printf ("\trun_length_minus1[%d] = %d\n", i, picparm->run_length_minus1[i]);

				}
				break;
			case H264_SLICE_GROUP_MAP_DISPERSED:
				break;
			case H264_SLICE_GROUP_MAP_FOREGROUND:
				for (i = 0; i < picparm->num_slice_groups_minus1; i++) {
					printf ("\ttop_left[%d] = %d\n", i, picparm->top_left[i]);
					printf ("\tbottom_right[%d] = %d\n", i, picparm->bottom_right[i]);

				}
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_BOX:
			case H264_SLICE_GROUP_MAP_CHANGING_VERTICAL:
			case H264_SLICE_GROUP_MAP_CHANGING_HORIZONTAL:
				printf ("\tslice_group_change_direction_flag = %d\n", picparm->slice_group_change_direction_flag);
				printf ("\tslice_group_change_rate_minus1 = %d\n", picparm->slice_group_change_rate_minus1);
				break;
			case H264_SLICE_GROUP_MAP_EXPLICIT:
				printf ("\tpic_size_in_map_units_minus1 = %d\n", picparm->pic_size_in_map_units_minus1);
				for (i = 0; i <= picparm->pic_size_in_map_units_minus1; i++)
					printf ("\tslice_group_id[%d] = %d\n", i, picparm->slice_group_id[i]);
				break;
		}
	}
	printf ("\tnum_ref_idx_l0_default_active_minus1 = %d\n", picparm->num_ref_idx_l0_default_active_minus1);
	printf ("\tnum_ref_idx_l1_default_active_minus1 = %d\n", picparm->num_ref_idx_l1_default_active_minus1);
	printf ("\tweighted_pred_flag = %d\n", picparm->weighted_pred_flag);
	printf ("\tweighted_bipred_idc = %d\n", picparm->weighted_bipred_idc);
	printf ("\tpic_init_qp_minus26 = %d\n", picparm->pic_init_qp_minus26);
	printf ("\tpic_init_qs_minus26 = %d\n", picparm->pic_init_qs_minus26);
	printf ("\tchroma_qp_index_offset = %d\n", picparm->chroma_qp_index_offset);
	printf ("\tdeblocking_filter_control_present_flag = %d\n", picparm->deblocking_filter_control_present_flag);
	printf ("\tconstrained_intra_pred_flag = %d\n", picparm->constrained_intra_pred_flag);
	printf ("\tredundant_pic_cnt_present_flag = %d\n", picparm->redundant_pic_cnt_present_flag);
	printf ("\ttransform_8x8_mode_flag = %d\n", picparm->transform_8x8_mode_flag);
	printf ("\tpic_scaling_matrix_present_flag = %d\n", picparm->pic_scaling_matrix_present_flag);
	if (picparm->pic_scaling_matrix_present_flag) {
		int i, j;
		for (i = 0; i < (picparm->chroma_format_idc == 3 ? 12 : 8); i++) {
			printf ("\tpic_scaling_list_present_flag[%d] = %d\n", i, picparm->pic_scaling_list_present_flag[i]);
			if (picparm->pic_scaling_list_present_flag[i]) {
				printf ("\tuse_default_scaling_matrix_flag[%d] = %d\n", i, picparm->use_default_scaling_matrix_flag[i]);
				if (!picparm->use_default_scaling_matrix_flag[i]) {
					for (j = 0; j < (i < 6 ? 16 : 64); j++) {
						if (i < 6)
							printf ("\tpic_scaling_list[%d][%d] = %d\n", i, j, picparm->pic_scaling_list_4x4[i][j]);
						else
							printf ("\tpic_scaling_list[%d][%d] = %d\n", i, j, picparm->pic_scaling_list_8x8[i-6][j]);
					}
				}
			}
		}
	}
	printf ("\tsecond_chroma_qp_index_offset = %d\n", picparm->second_chroma_qp_index_offset);
}